

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  int iVar1;
  long lVar2;
  code *in_RSI;
  undefined8 in_RDI;
  secp256k1_gej actual;
  secp256k1_gej expected;
  secp256k1_scalar tmp2;
  secp256k1_scalar tmp1;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_gej t1p;
  secp256k1_gej t0p;
  secp256k1_gej ptgj_1;
  secp256k1_ge ptg_4;
  size_t t1i;
  size_t t0i;
  size_t s1i;
  size_t s0i;
  size_t TOP;
  secp256k1_scalar rs;
  secp256k1_gej p0j;
  secp256k1_ge ptg_3;
  size_t i_2;
  secp256k1_ge ptg_2;
  size_t i_1;
  size_t sizes [3];
  size_t j;
  size_t i;
  secp256k1_ge ptg_1;
  secp256k1_gej ptgj;
  secp256k1_ge ptg;
  ecmult_multi_data data;
  secp256k1_gej r2;
  secp256k1_gej r;
  secp256k1_ge pt [32];
  secp256k1_scalar sc [32];
  int ncount;
  secp256k1_ge *psVar3;
  uint uVar4;
  secp256k1_gej *in_stack_ffffffffffffe990;
  secp256k1_scalar *in_stack_ffffffffffffe998;
  secp256k1_scalar *in_stack_ffffffffffffe9a0;
  int in_stack_ffffffffffffe9ac;
  secp256k1_ge *in_stack_ffffffffffffe9b0;
  secp256k1_scalar *in_stack_ffffffffffffe9b8;
  secp256k1_scalar *in_stack_ffffffffffffe9c0;
  secp256k1_scalar *in_stack_ffffffffffffe9c8;
  secp256k1_scalar *in_stack_ffffffffffffe9d0;
  secp256k1_gej *in_stack_ffffffffffffe9d8;
  secp256k1_ge *in_stack_ffffffffffffe9e0;
  secp256k1_gej *in_stack_ffffffffffffea08;
  secp256k1_gej *in_stack_ffffffffffffea10;
  secp256k1_fe *in_stack_ffffffffffffeb18;
  secp256k1_ge *in_stack_ffffffffffffeb20;
  secp256k1_gej *in_stack_ffffffffffffeb28;
  secp256k1_gej *in_stack_ffffffffffffeb30;
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  undefined1 local_1248 [88];
  ulong local_11f0;
  undefined1 local_11e8 [88];
  ulong local_1190;
  undefined8 local_1188 [4];
  ulong local_1168;
  ulong local_1160;
  undefined1 local_1158 [216];
  undefined1 local_1080 [88];
  undefined8 *local_1028;
  undefined1 *local_1020;
  undefined1 local_f98 [128];
  undefined1 local_f18 [88];
  undefined1 auStack_ec0 [120];
  secp256k1_scalar *in_stack_fffffffffffff1b8;
  secp256k1_scalar *in_stack_fffffffffffff1c0;
  secp256k1_gej *in_stack_fffffffffffff1c8;
  secp256k1_gej *in_stack_fffffffffffff1d0;
  undefined8 local_418 [4];
  undefined1 auStack_3f8 [996];
  int local_14;
  code *local_10;
  undefined8 local_8;
  
  local_1028 = local_418;
  local_1020 = local_f18;
  psVar3 = (secp256k1_ge *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = (*in_RSI)(&CTX->error_callback,in_RDI,local_f98,0,ecmult_multi_callback,&local_1028);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1238,
            "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0)"
           );
    abort();
  }
  local_14 = 0;
  while( true ) {
    if (COUNT <= local_14) {
      local_14 = 0;
      do {
        if (COUNT <= local_14) {
          for (local_14 = 0; local_14 < COUNT; local_14 = local_14 + 1) {
            secp256k1_gej_set_infinity((secp256k1_gej *)0x14176e);
            testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
            for (local_1190 = 0; local_1190 < 0x14; local_1190 = local_1190 + 1) {
              local_418[local_1190 * 4] = local_418[0];
              local_418[local_1190 * 4 + 1] = local_418[1];
              local_418[local_1190 * 4 + 2] = local_418[2];
              *(undefined8 *)(auStack_3f8 + local_1190 * 0x20 + -8) = local_418[3];
              testutil_random_ge_test(in_stack_ffffffffffffe9b0);
              memcpy(local_f18 + local_1190 * 0x58,local_11e8,0x58);
              secp256k1_gej_add_ge_var
                        (in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
                         in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
            }
            secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,
                             in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
            psVar3 = (secp256k1_ge *)0x14;
            iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                                ecmult_multi_callback,&local_1028);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                      ,0x12af,
                      "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
                     );
              abort();
            }
            iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                      ,0x12b0,"test condition failed: secp256k1_gej_eq_var(&r, &r2)");
              abort();
            }
          }
          for (local_14 = 0; local_14 < COUNT; local_14 = local_14 + 1) {
            secp256k1_scalar_set_int
                      ((secp256k1_scalar *)in_stack_ffffffffffffe990,(uint)((ulong)psVar3 >> 0x20));
            testutil_random_ge_test(in_stack_ffffffffffffe9b0);
            for (local_11f0 = 0; local_11f0 < 0x14; local_11f0 = local_11f0 + 1) {
              testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
              memcpy(local_f18 + local_11f0 * 0x58,local_1248,0x58);
              secp256k1_scalar_add
                        (in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,
                         (secp256k1_scalar *)in_stack_ffffffffffffe9b0);
            }
            secp256k1_gej_set_ge(in_stack_ffffffffffffe990,psVar3);
            secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,
                             in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
            psVar3 = (secp256k1_ge *)0x14;
            iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                                ecmult_multi_callback,&local_1028);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                      ,0x12c4,
                      "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
                     );
              abort();
            }
            iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                      ,0x12c5,"test condition failed: secp256k1_gej_eq_var(&r, &r2)");
              abort();
            }
          }
          for (local_14 = 0; local_14 < 0x14; local_14 = local_14 + 1) {
            testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
            testutil_random_ge_test(in_stack_ffffffffffffe9b0);
          }
          secp256k1_scalar_set_int
                    ((secp256k1_scalar *)in_stack_ffffffffffffe990,(uint)((ulong)psVar3 >> 0x20));
          uVar4 = 0;
          iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&local_1028);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x12cf,
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
                   );
            abort();
          }
          secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffe990,uVar4);
          secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffe990,uVar4);
          secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffe990,uVar4);
          secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffe990,uVar4);
          iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&local_1028,6);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x12d4,
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6)"
                   );
            abort();
          }
          psVar3 = (secp256k1_ge *)0x5;
          iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&local_1028);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x12d5,
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5)"
                   );
            abort();
          }
          iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x141e0e);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x12d6,"test condition failed: secp256k1_gej_is_infinity(&r)");
            abort();
          }
          testutil_random_ge_test(in_stack_ffffffffffffe9b0);
          secp256k1_gej_set_ge(in_stack_ffffffffffffe990,psVar3);
          local_1308 = 0;
          do {
            if (7 < local_1308) {
              return;
            }
            for (local_1310 = 0; local_1310 < 8; local_1310 = local_1310 + 1) {
              secp256k1_scalar_set_int
                        ((secp256k1_scalar *)in_stack_ffffffffffffe990,(uint)((ulong)psVar3 >> 0x20)
                        );
              secp256k1_scalar_cond_negate
                        ((secp256k1_scalar *)in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9ac);
              secp256k1_scalar_set_int
                        ((secp256k1_scalar *)in_stack_ffffffffffffe990,(uint)((ulong)psVar3 >> 0x20)
                        );
              secp256k1_scalar_cond_negate
                        ((secp256k1_scalar *)in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9ac);
              secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,
                               in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
              secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,
                               in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
              for (local_12f8 = 0; local_12f8 < 8; local_12f8 = local_12f8 + 1) {
                for (local_1300 = 0; uVar4 = (uint)((ulong)psVar3 >> 0x20), local_1300 < 8;
                    local_1300 = local_1300 + 1) {
                  secp256k1_ge_set_gej(in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8);
                  secp256k1_ge_set_gej(in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8);
                  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffe990,uVar4);
                  secp256k1_scalar_cond_negate
                            ((secp256k1_scalar *)in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9ac
                            );
                  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffe990,uVar4);
                  secp256k1_scalar_cond_negate
                            ((secp256k1_scalar *)in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9ac
                            );
                  secp256k1_scalar_mul
                            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                             in_stack_ffffffffffffe9c0);
                  secp256k1_scalar_mul
                            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                             in_stack_ffffffffffffe9c0);
                  secp256k1_scalar_add
                            (in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,
                             (secp256k1_scalar *)in_stack_ffffffffffffe9b0);
                  secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,
                                   in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
                  psVar3 = (secp256k1_ge *)0x0;
                  iVar1 = (*local_10)(&CTX->error_callback,local_8,&stack0xffffffffffffe998,
                                      &secp256k1_scalar_zero,ecmult_multi_callback,&local_1028);
                  if (iVar1 == 0) {
                    fprintf(_stderr,"%s:%d: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                            ,0x1302,
                            "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2)"
                           );
                    abort();
                  }
                  iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
                  if (iVar1 == 0) {
                    fprintf(_stderr,"%s:%d: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                            ,0x1303,
                            "test condition failed: secp256k1_gej_eq_var(&actual, &expected)");
                    abort();
                  }
                }
              }
            }
            local_1308 = local_1308 + 1;
          } while( true );
        }
        local_1188[0] = 2;
        local_1188[1] = 10;
        local_1188[2] = 0x20;
        for (local_1168 = 0; local_1168 < 3; local_1168 = local_1168 + 1) {
          for (local_1160 = 0; local_1160 < 0x20; local_1160 = local_1160 + 1) {
            testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
            secp256k1_ge_set_infinity((secp256k1_ge *)0x140e02);
          }
          psVar3 = (secp256k1_ge *)local_1188[local_1168];
          iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&local_1028);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x1269,
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
                   );
            abort();
          }
          iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x140ec4);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x126a,"test condition failed: secp256k1_gej_is_infinity(&r)");
            abort();
          }
        }
        for (local_1168 = 0; local_1168 < 3; local_1168 = local_1168 + 1) {
          for (local_1160 = 0; local_1160 < 0x20; local_1160 = local_1160 + 1) {
            testutil_random_ge_test(in_stack_ffffffffffffe9b0);
            memcpy(local_f18 + local_1160 * 0x58,local_1158,0x58);
            secp256k1_scalar_set_int
                      ((secp256k1_scalar *)in_stack_ffffffffffffe990,(uint)((ulong)psVar3 >> 0x20));
          }
          psVar3 = (secp256k1_ge *)local_1188[local_1168];
          iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&local_1028);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x1273,
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
                   );
            abort();
          }
          iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x14106d);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x1274,"test condition failed: secp256k1_gej_is_infinity(&r)");
            abort();
          }
        }
        for (local_1168 = 0; uVar4 = (uint)((ulong)psVar3 >> 0x20), local_1168 < 3;
            local_1168 = local_1168 + 1) {
          testutil_random_ge_test(in_stack_ffffffffffffe9b0);
          for (local_1160 = 0; local_1160 < 0x10; local_1160 = local_1160 + 1) {
            testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
            secp256k1_scalar_negate(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
            memcpy(local_f18 + local_1160 * 0xb0,local_1158,0x58);
            memcpy(local_f18 + (local_1160 * 2 + 1) * 0x58,local_1158,0x58);
          }
          psVar3 = (secp256k1_ge *)local_1188[local_1168];
          iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&local_1028);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x1280,
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
                   );
            abort();
          }
          iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x141291);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x1281,"test condition failed: secp256k1_gej_is_infinity(&r)");
            abort();
          }
          testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
          for (local_1160 = 0; local_1160 < 0x10; local_1160 = local_1160 + 1) {
            testutil_random_ge_test(in_stack_ffffffffffffe9b0);
            local_418[local_1160 * 8] = local_418[0];
            local_418[local_1160 * 8 + 1] = local_418[1];
            local_418[local_1160 * 8 + 2] = local_418[2];
            *(undefined8 *)(auStack_3f8 + local_1160 * 0x40 + -8) = local_418[3];
            lVar2 = local_1160 * 2 + 1;
            local_418[lVar2 * 4] = local_418[0];
            local_418[lVar2 * 4 + 1] = local_418[1];
            local_418[lVar2 * 4 + 2] = local_418[2];
            *(undefined8 *)(auStack_3f8 + lVar2 * 0x20 + -8) = local_418[3];
            memcpy(local_f18 + local_1160 * 0xb0,local_1158,0x58);
            secp256k1_ge_neg((secp256k1_ge *)in_stack_ffffffffffffe990,psVar3);
          }
          psVar3 = (secp256k1_ge *)local_1188[local_1168];
          iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&local_1028);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x128d,
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
                   );
            abort();
          }
          iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1414d3);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                    ,0x128e,"test condition failed: secp256k1_gej_is_infinity(&r)");
            abort();
          }
        }
        testutil_random_ge_test(in_stack_ffffffffffffe9b0);
        secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffe990,uVar4);
        memcpy(local_f18,local_1158,0x58);
        for (local_1160 = 1; local_1160 < 0x20; local_1160 = local_1160 + 1) {
          memcpy(local_f18 + local_1160 * 0x58,local_1158,0x58);
          testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
          secp256k1_scalar_add
                    (in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,
                     (secp256k1_scalar *)in_stack_ffffffffffffe9b0);
          secp256k1_scalar_negate(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
        }
        psVar3 = (secp256k1_ge *)0x20;
        iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                            ecmult_multi_callback,&local_1028);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                  ,0x129c,
                  "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32)"
                 );
          abort();
        }
        iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1416e2);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                  ,0x129d,"test condition failed: secp256k1_gej_is_infinity(&r)");
          abort();
        }
        local_14 = local_14 + 1;
      } while( true );
    }
    testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
    testutil_random_scalar_order((secp256k1_scalar *)in_stack_ffffffffffffe9b0);
    testutil_random_ge_test(in_stack_ffffffffffffe9b0);
    secp256k1_gej_set_ge(in_stack_ffffffffffffe990,psVar3);
    memcpy(local_f18,local_1080,0x58);
    memcpy(auStack_ec0,&secp256k1_ge_const_g,0x58);
    secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,
                     in_stack_fffffffffffff1b8);
    iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,local_418,ecmult_multi_callback,
                        &local_1028,0);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1248,
              "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0)"
             );
      abort();
    }
    iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1249,"test condition failed: secp256k1_gej_eq_var(&r, &r2)");
      abort();
    }
    secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,
                     in_stack_fffffffffffff1b8);
    iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                        ecmult_multi_callback,&local_1028,1);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x124d,
              "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1)"
             );
      abort();
    }
    iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
    if (iVar1 == 0) break;
    iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                        ecmult_multi_false_callback,&local_1028,1);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1251,
              "test condition failed: !ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1)"
             );
      abort();
    }
    secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,
                     in_stack_fffffffffffff1b8);
    iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,&secp256k1_scalar_zero,
                        ecmult_multi_callback,&local_1028,2);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1255,
              "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2)"
             );
      abort();
    }
    iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1256,"test condition failed: secp256k1_gej_eq_var(&r, &r2)");
      abort();
    }
    secp256k1_ecmult(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,
                     in_stack_fffffffffffff1b8);
    psVar3 = (secp256k1_ge *)0x1;
    iVar1 = (*local_10)(&CTX->error_callback,local_8,local_f98,auStack_3f8,ecmult_multi_callback,
                        &local_1028);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x125a,
              "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1)"
             );
      abort();
    }
    iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x125b,"test condition failed: secp256k1_gej_eq_var(&r, &r2)");
      abort();
    }
    local_14 = local_14 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c",
          0x124e,"test condition failed: secp256k1_gej_eq_var(&r, &r2)");
  abort();
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_scalar_order(&sc[0]);
        testutil_random_scalar_order(&sc[1]);

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_ge_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            testutil_random_ge_test(&ptg);
            for (i = 0; i < 16; i++) {
                testutil_random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            testutil_random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                testutil_random_ge_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        testutil_random_ge_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            testutil_random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        testutil_random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            testutil_random_ge_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        testutil_random_ge_test(&ptg);
        for (i = 0; i < 20; i++) {
            testutil_random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        testutil_random_scalar_order(&sc[ncount]);
        testutil_random_ge_test(&pt[ncount]);
    }

    secp256k1_scalar_set_int(&sc[0], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_set_int(&sc[1], 0);
    secp256k1_scalar_set_int(&sc[2], 0);
    secp256k1_scalar_set_int(&sc[3], 0);
    secp256k1_scalar_set_int(&sc[4], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}